

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

void Gia_MuxStructDump_rec(Gia_Man_t *p,int iObj,int fFirst,Vec_Str_t *vStr,int nDigitsId)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  Gia_Obj_t *pGVar7;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar7 = p->pObjs + (uint)iObj;
  if (fFirst == 0) {
    if (p->pMuxes == (uint *)0x0) {
      return;
    }
    if (p->pMuxes[(uint)iObj] == 0) {
      return;
    }
    if (0 < p->pRefs[(uint)iObj]) {
      return;
    }
  }
  uVar3 = 0xffffffff;
  if (p->pMuxes != (uint *)0x0) {
    if (p->nObjs <= iObj) goto LAB_00220472;
    uVar1 = p->pMuxes[(uint)iObj];
    if (uVar1 != 0) {
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar3 = uVar1 >> 1;
    }
  }
  uVar1 = vStr->nCap;
  if (vStr->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar4;
      sVar6 = 0x10;
    }
    else {
      sVar6 = (ulong)uVar1 * 2;
      if ((int)sVar6 <= (int)uVar1) goto LAB_00220015;
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar6);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,sVar6);
      }
      vStr->pArray = pcVar4;
    }
    vStr->nCap = (int)sVar6;
  }
LAB_00220015:
  iVar5 = vStr->nSize;
  vStr->nSize = iVar5 + 1;
  vStr->pArray[iVar5] = '[';
  uVar1 = vStr->nCap;
  if (vStr->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar6 = 0x10;
    }
    else {
      sVar6 = (ulong)uVar1 * 2;
      if ((int)sVar6 <= (int)uVar1) goto LAB_00220084;
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar6);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,sVar6);
      }
    }
    vStr->pArray = pcVar4;
    vStr->nCap = (int)sVar6;
  }
LAB_00220084:
  iVar5 = vStr->nSize;
  vStr->nSize = iVar5 + 1;
  vStr->pArray[iVar5] = '(';
  if (((p->pMuxes == (uint *)0x0) || (p->pMuxes[(int)uVar3] == 0)) || (p->pRefs[(int)uVar3] != 0)) {
    Vec_StrPrintNumStar(vStr,uVar3,nDigitsId);
  }
  else {
    Gia_MuxStructDump_rec(p,uVar3,0,vStr,nDigitsId);
  }
  uVar3 = vStr->nCap;
  if (vStr->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar6 = 0x10;
    }
    else {
      sVar6 = (ulong)uVar3 * 2;
      if ((int)sVar6 <= (int)uVar3) goto LAB_00220134;
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar6);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,sVar6);
      }
    }
    vStr->pArray = pcVar4;
    vStr->nCap = (int)sVar6;
  }
LAB_00220134:
  iVar5 = vStr->nSize;
  vStr->nSize = iVar5 + 1;
  vStr->pArray[iVar5] = ')';
  if (p->pMuxes == (uint *)0x0) {
LAB_00220197:
    pGVar2 = p->pObjs;
    if ((pGVar7 < pGVar2) || (pGVar2 + p->nObjs <= pGVar7)) goto LAB_00220472;
    Gia_MuxStructDump_rec
              (p,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555 -
                 (*(uint *)&pGVar7->field_0x4 & 0x1fffffff),0,vStr,nDigitsId);
    uVar3 = vStr->nCap;
    if (vStr->nSize == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(vStr->pArray,0x10);
        }
        sVar6 = 0x10;
      }
      else {
        sVar6 = (ulong)uVar3 * 2;
        if ((int)sVar6 <= (int)uVar3) goto LAB_002202f5;
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar6);
        }
        else {
          pcVar4 = (char *)realloc(vStr->pArray,sVar6);
        }
      }
      vStr->pArray = pcVar4;
      vStr->nCap = (int)sVar6;
    }
LAB_002202f5:
    iVar5 = vStr->nSize;
    vStr->nSize = iVar5 + 1;
    vStr->pArray[iVar5] = '|';
    pGVar2 = p->pObjs;
    if ((pGVar7 < pGVar2) || (pGVar2 + p->nObjs <= pGVar7)) {
LAB_00220472:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar5 = (int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2);
    uVar3 = *(uint *)pGVar7;
  }
  else {
    pGVar2 = p->pObjs;
    if ((pGVar7 < pGVar2) || (pGVar2 + p->nObjs <= pGVar7)) goto LAB_00220472;
    uVar3 = p->pMuxes[(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555];
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((uVar3 & 1) == 0) goto LAB_00220197;
    pGVar2 = p->pObjs;
    if ((pGVar7 < pGVar2) || (pGVar2 + p->nObjs <= pGVar7)) goto LAB_00220472;
    Gia_MuxStructDump_rec
              (p,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555 -
                 (*(uint *)pGVar7 & 0x1fffffff),0,vStr,nDigitsId);
    uVar3 = vStr->nCap;
    if (vStr->nSize == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(vStr->pArray,0x10);
        }
        sVar6 = 0x10;
      }
      else {
        sVar6 = (ulong)uVar3 * 2;
        if ((int)sVar6 <= (int)uVar3) goto LAB_00220382;
        if (vStr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar6);
        }
        else {
          pcVar4 = (char *)realloc(vStr->pArray,sVar6);
        }
      }
      vStr->pArray = pcVar4;
      vStr->nCap = (int)sVar6;
    }
LAB_00220382:
    iVar5 = vStr->nSize;
    vStr->nSize = iVar5 + 1;
    vStr->pArray[iVar5] = '|';
    pGVar2 = p->pObjs;
    if ((pGVar7 < pGVar2) || (pGVar2 + p->nObjs <= pGVar7)) goto LAB_00220472;
    iVar5 = (int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2);
    uVar3 = *(uint *)&pGVar7->field_0x4;
  }
  Gia_MuxStructDump_rec(p,iVar5 * -0x55555555 - (uVar3 & 0x1fffffff),0,vStr,nDigitsId);
  uVar3 = vStr->nCap;
  if (vStr->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar6 = 0x10;
    }
    else {
      sVar6 = (ulong)uVar3 * 2;
      if ((int)sVar6 <= (int)uVar3) goto LAB_0022043a;
      if (vStr->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar6);
      }
      else {
        pcVar4 = (char *)realloc(vStr->pArray,sVar6);
      }
    }
    vStr->pArray = pcVar4;
    vStr->nCap = (int)sVar6;
  }
LAB_0022043a:
  iVar5 = vStr->nSize;
  vStr->nSize = iVar5 + 1;
  vStr->pArray[iVar5] = ']';
  return;
}

Assistant:

void Gia_MuxStructDump_rec( Gia_Man_t * p, int iObj, int fFirst, Vec_Str_t * vStr, int nDigitsId )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    int iCtrl;
    if ( !fFirst && (!Gia_ObjIsMuxId(p, iObj) || Gia_ObjRefNumId(p, iObj) > 0) )
        return;
    iCtrl = Gia_ObjFaninId2p(p, pObj);
    Vec_StrPush( vStr, '[' );
    Vec_StrPush( vStr, '(' );
    if ( Gia_ObjIsMuxId(p, iCtrl) && Gia_ObjRefNumId(p, iCtrl) == 0 )
        Gia_MuxStructDump_rec( p, iCtrl, 0, vStr, nDigitsId );
    else
        Vec_StrPrintNumStar( vStr, iCtrl, nDigitsId );
    Vec_StrPush( vStr, ')' );
    if ( Gia_ObjFaninC2(p, pObj) )
    {
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId0p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, '|' );
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId1p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, ']' );
    }
    else
    {
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId1p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, '|' );
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId0p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, ']' );
    }
}